

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyRigidBodyCollisionConfiguration.cpp
# Opt level: O0

void __thiscall
btSoftBodyRigidBodyCollisionConfiguration::btSoftBodyRigidBodyCollisionConfiguration
          (btSoftBodyRigidBodyCollisionConfiguration *this,
          btDefaultCollisionConstructionInfo *constructionInfo)

{
  void *pvVar1;
  int *piVar2;
  btPoolAllocator *this_00;
  undefined8 *in_RDI;
  void *mem_1;
  int collisionAlgorithmMaxElementSize;
  int maxSize2;
  int maxSize1;
  int maxSize0;
  int curElemSize;
  void *mem;
  int in_stack_ffffffffffffff3c;
  SwappedCreateFunc *in_stack_ffffffffffffff40;
  int local_38 [8];
  void *local_18;
  
  btDefaultCollisionConfiguration::btDefaultCollisionConfiguration
            (&this->super_btDefaultCollisionConfiguration,constructionInfo);
  *in_RDI = &PTR__btSoftBodyRigidBodyCollisionConfiguration_002e88b8;
  pvVar1 = btAlignedAllocInternal((size_t)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  local_18 = pvVar1;
  btSoftSoftCollisionAlgorithm::CreateFunc::CreateFunc((CreateFunc *)in_stack_ffffffffffffff40);
  in_RDI[0x17] = pvVar1;
  pvVar1 = btAlignedAllocInternal((size_t)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  local_18 = pvVar1;
  btSoftRigidCollisionAlgorithm::CreateFunc::CreateFunc((CreateFunc *)in_stack_ffffffffffffff40);
  in_RDI[0x18] = pvVar1;
  pvVar1 = btAlignedAllocInternal((size_t)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  local_18 = pvVar1;
  btSoftRigidCollisionAlgorithm::CreateFunc::CreateFunc((CreateFunc *)in_stack_ffffffffffffff40);
  in_RDI[0x19] = pvVar1;
  *(undefined1 *)(in_RDI[0x19] + 8) = 1;
  pvVar1 = btAlignedAllocInternal((size_t)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  local_18 = pvVar1;
  btSoftBodyConcaveCollisionAlgorithm::CreateFunc::CreateFunc
            ((CreateFunc *)in_stack_ffffffffffffff40);
  in_RDI[0x1a] = pvVar1;
  pvVar1 = btAlignedAllocInternal((size_t)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  local_18 = pvVar1;
  btSoftBodyConcaveCollisionAlgorithm::SwappedCreateFunc::SwappedCreateFunc
            (in_stack_ffffffffffffff40);
  in_RDI[0x1b] = pvVar1;
  *(undefined1 *)(in_RDI[0x1b] + 8) = 1;
  if (((*(byte *)(in_RDI + 5) & 1) != 0) && (in_RDI[4] != 0)) {
    local_38[4] = btPoolAllocator::getElementSize((btPoolAllocator *)in_RDI[4]);
    local_38[3] = 0x30;
    local_38[2] = 0x28;
    local_38[1] = 0xf8;
    piVar2 = btMax<int>(local_38 + 3,local_38 + 2);
    local_38[0] = *piVar2;
    this_00 = (btPoolAllocator *)btMax<int>(local_38,local_38 + 1);
    local_38[0] = this_00->m_elemSize;
    if (local_38[4] < local_38[0]) {
      btPoolAllocator::~btPoolAllocator((btPoolAllocator *)0x296664);
      btAlignedFreeInternal((void *)0x296672);
      pvVar1 = btAlignedAllocInternal((size_t)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      btPoolAllocator::btPoolAllocator(this_00,(int)((ulong)pvVar1 >> 0x20),(int)pvVar1);
      in_RDI[4] = pvVar1;
    }
  }
  return;
}

Assistant:

btSoftBodyRigidBodyCollisionConfiguration::btSoftBodyRigidBodyCollisionConfiguration(const btDefaultCollisionConstructionInfo& constructionInfo)
:btDefaultCollisionConfiguration(constructionInfo)
{
	void* mem;

	mem = btAlignedAlloc(sizeof(btSoftSoftCollisionAlgorithm::CreateFunc),16);
	m_softSoftCreateFunc = new(mem) btSoftSoftCollisionAlgorithm::CreateFunc;

	mem = btAlignedAlloc(sizeof(btSoftRigidCollisionAlgorithm::CreateFunc),16);
	m_softRigidConvexCreateFunc = new(mem) btSoftRigidCollisionAlgorithm::CreateFunc;

	mem = btAlignedAlloc(sizeof(btSoftRigidCollisionAlgorithm::CreateFunc),16);
	m_swappedSoftRigidConvexCreateFunc = new(mem) btSoftRigidCollisionAlgorithm::CreateFunc;
	m_swappedSoftRigidConvexCreateFunc->m_swapped=true;

#ifdef ENABLE_SOFTBODY_CONCAVE_COLLISIONS
	mem = btAlignedAlloc(sizeof(btSoftBodyConcaveCollisionAlgorithm::CreateFunc),16);
	m_softRigidConcaveCreateFunc = new(mem) btSoftBodyConcaveCollisionAlgorithm::CreateFunc;

	mem = btAlignedAlloc(sizeof(btSoftBodyConcaveCollisionAlgorithm::CreateFunc),16);
	m_swappedSoftRigidConcaveCreateFunc = new(mem) btSoftBodyConcaveCollisionAlgorithm::SwappedCreateFunc;
	m_swappedSoftRigidConcaveCreateFunc->m_swapped=true;
#endif

	//replace pool by a new one, with potential larger size

	if (m_ownsCollisionAlgorithmPool && m_collisionAlgorithmPool)
	{
		int curElemSize = m_collisionAlgorithmPool->getElementSize();
		///calculate maximum element size, big enough to fit any collision algorithm in the memory pool


		int maxSize0 = sizeof(btSoftSoftCollisionAlgorithm);
		int maxSize1 = sizeof(btSoftRigidCollisionAlgorithm);
		int maxSize2 = sizeof(btSoftBodyConcaveCollisionAlgorithm);

		int	collisionAlgorithmMaxElementSize = btMax(maxSize0,maxSize1);
		collisionAlgorithmMaxElementSize = btMax(collisionAlgorithmMaxElementSize,maxSize2);
		
		if (collisionAlgorithmMaxElementSize > curElemSize)
		{
			m_collisionAlgorithmPool->~btPoolAllocator();
			btAlignedFree(m_collisionAlgorithmPool);
			void* mem = btAlignedAlloc(sizeof(btPoolAllocator),16);
			m_collisionAlgorithmPool = new(mem) btPoolAllocator(collisionAlgorithmMaxElementSize,constructionInfo.m_defaultMaxCollisionAlgorithmPoolSize);
		}
	}

}